

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

el_action_t ed_prev_word(EditLine *el,wint_t c)

{
  wchar_t *pwVar1;
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_line).cursor == (el->el_line).buffer) {
    el_local._7_1_ = '\x06';
  }
  else {
    pwVar1 = c__prev_word((el->el_line).cursor,(el->el_line).buffer,(el->el_state).argument,
                          ce__isword);
    (el->el_line).cursor = pwVar1;
    if (((el->el_map).type == L'\x01') && ((el->el_chared).c_vcmd.action != L'\0')) {
      cv_delfini(el);
      el_local._7_1_ = '\x04';
    }
    else {
      el_local._7_1_ = '\x05';
    }
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_prev_word(EditLine *el, wint_t c __attribute__((__unused__)))
{

	if (el->el_line.cursor == el->el_line.buffer)
		return CC_ERROR;

	el->el_line.cursor = c__prev_word(el->el_line.cursor,
	    el->el_line.buffer,
	    el->el_state.argument,
	    ce__isword);

	if (el->el_map.type == MAP_VI)
		if (el->el_chared.c_vcmd.action != NOP) {
			cv_delfini(el);
			return CC_REFRESH;
		}
	return CC_CURSOR;
}